

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_complex.h
# Opt level: O2

string * __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>
::edges_to_string_abi_cxx11_
          (string *__return_storage_ptr__,
          Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>
          *this)

{
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>
  *pSVar1;
  type_conflict1 tVar2;
  graph_type *g;
  ostream *poVar3;
  ostringstream stream;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>
  *local_1d8;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>
  *local_1d0;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>
  *local_1c8;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>
  *local_1c0;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>
  *local_1b8;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>
  *local_1b0;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_1c8 = this + 0x38;
  local_1d0 = *(Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>
                **)(this + 0x38);
  local_1d8 = this;
  local_1c0 = this;
  local_1b8 = local_1c8;
  local_1b0 = local_1c8;
  while( true ) {
    tVar2 = boost::iterators::operator!=
                      ((iterator_facade<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::forward_traversal_tag,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                        *)&local_1d8,
                       (iterator_facade<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::forward_traversal_tag,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                        *)&local_1c0);
    pSVar1 = local_1d0;
    if (!tVar2) break;
    poVar3 = std::operator<<((ostream *)local_1a8,"{");
    std::ostream::operator<<((ostream *)poVar3,*(int *)(pSVar1 + 0x20));
    poVar3 = std::operator<<(poVar3,",");
    std::ostream::operator<<((ostream *)poVar3,*(int *)(pSVar1 + 0x24));
    std::operator<<(poVar3,"} ");
    if (local_1d0 != local_1c8) {
      local_1d0 = *(Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>
                    **)local_1d0;
    }
  }
  std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string edges_to_string() const {
    std::ostringstream stream;
    for (auto edge : edge_range())
      stream << "{" << (*this)[edge].first() << "," << (*this)[edge].second() << "} ";
    stream << std::endl;
    return stream.str();
  }